

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyBlockElimination.cc
# Opt level: O2

bool flow::transform::emptyBlockElimination(IRHandler *handler)

{
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *plVar1;
  Value *replacement;
  pointer ppBVar2;
  TerminateInstr *pTVar3;
  long lVar4;
  Instr *this;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  pointer ppBVar7;
  bool bVar8;
  BasicBlock *bb;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> eliminated;
  BasicBlock *local_58;
  IRHandler *local_50;
  _List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> local_48;
  
  local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  plVar1 = &handler->blocks_;
  p_Var5 = (_List_node_base *)plVar1;
  local_50 = handler;
  do {
    do {
      p_Var5 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      p_Var6 = (_List_node_base *)&local_48;
      if (p_Var5 == (_List_node_base *)plVar1) {
LAB_0014427f:
        while (p_Var6 = (((_List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)
                         &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var6 != (_List_node_base *)&local_48) {
          IRHandler::erase(((BasicBlock *)p_Var6[1]._M_next)->handler_,
                           (BasicBlock *)p_Var6[1]._M_next);
        }
        bVar8 = local_48._M_impl._M_node._M_size != 0;
        std::__cxx11::_List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::_M_clear
                  (&local_48);
        return bVar8;
      }
      local_58 = (BasicBlock *)p_Var5[1]._M_next;
    } while ((((long)(local_58->code_).
                     super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_58->code_).
                     super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != 8) ||
             (pTVar3 = BasicBlock::getTerminator(local_58), pTVar3 == (TerminateInstr *)0x0)) ||
            (lVar4 = __dynamic_cast(pTVar3,&TerminateInstr::typeinfo,&BrInstr::typeinfo,0),
            lVar4 == 0));
    replacement = (Value *)**(undefined8 **)(lVar4 + 0x50);
    std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::push_back
              ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&local_48,&local_58)
    ;
    if (local_58 ==
        (BasicBlock *)
        (plVar1->
        super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
        )._M_impl._M_node.super__List_node_base._M_next[1]._M_next) {
      IRHandler::setEntryBlock(local_50,local_58);
      goto LAB_0014427f;
    }
    ppBVar2 = (local_58->predecessors_).
              super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppBVar7 = (local_58->predecessors_).
                   super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppBVar7 != ppBVar2;
        ppBVar7 = ppBVar7 + 1) {
      this = &BasicBlock::getTerminator(*ppBVar7)->super_Instr;
      Instr::replaceOperand(this,&local_58->super_Value,replacement);
    }
  } while( true );
}

Assistant:

bool emptyBlockElimination(IRHandler* handler) {
  std::list<BasicBlock*> eliminated;

  for (BasicBlock* bb : handler->basicBlocks()) {
    if (bb->size() != 1)
      continue;

    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      BasicBlock* newSuccessor = br->targetBlock();
      eliminated.push_back(bb);
      if (bb == handler->getEntryBlock()) {
        handler->setEntryBlock(bb);
        break;
      } else {
        for (BasicBlock* pred : bb->predecessors()) {
          pred->getTerminator()->replaceOperand(bb, newSuccessor);
        }
      }
    }
  }

  for (BasicBlock* bb : eliminated) {
    bb->getHandler()->erase(bb);
  }

  return eliminated.size() > 0;
}